

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

bool __thiscall Js::JavascriptArray::BigIndex::operator==(BigIndex *this,BigIndex *rhs)

{
  uint32 uVar1;
  uint32 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  
  if (rhs->index == 0xffffffff) {
    if (this->index != 0xffffffff) {
      uVar1 = GetSmallIndex(this);
      uVar3 = GetBigIndex(rhs);
      return uVar3 == uVar1;
    }
    uVar3 = GetBigIndex(this);
    uVar4 = GetBigIndex(rhs);
  }
  else {
    if (this->index != 0xffffffff) {
      uVar1 = GetSmallIndex(this);
      uVar2 = GetSmallIndex(rhs);
      return uVar1 == uVar2;
    }
    uVar3 = GetBigIndex(this);
    uVar1 = GetSmallIndex(rhs);
    uVar4 = (uint64)uVar1;
  }
  return uVar3 == uVar4;
}

Assistant:

bool JavascriptArray::BigIndex::operator==(const BigIndex& rhs) const
    {
        if (rhs.IsSmallIndex() && this->IsSmallIndex())
        {
            return this->GetSmallIndex() == rhs.GetSmallIndex();
        }
        else if (rhs.IsSmallIndex() && !this->IsSmallIndex())
        {
            // if lhs is big promote rhs
            return this->GetBigIndex() == (uint64) rhs.GetSmallIndex();
        }
        else if (!rhs.IsSmallIndex() && this->IsSmallIndex())
        {
            // if rhs is big promote lhs
            return ((uint64)this->GetSmallIndex()) == rhs.GetBigIndex();
        }
        return this->GetBigIndex() == rhs.GetBigIndex();
    }